

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  TCoord *pTVar1;
  TArea *pTVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  PCell_conflict pTVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int ex;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long local_78;
  long local_60;
  
  uVar4 = worker->y;
  uVar17 = uVar4 >> 8;
  iVar16 = (int)(uVar4 >> 8);
  iVar12 = (int)((ulong)to_y >> 8);
  if ((iVar12 < worker->max_ey || iVar16 < worker->max_ey) &&
     (worker->min_ey <= iVar16 || worker->min_ey <= iVar12)) {
    uVar5 = worker->x;
    uVar15 = uVar5 >> 8;
    uVar14 = (uint)uVar5 & 0xff;
    uVar10 = (uint)uVar4 & 0xff;
    ex = (int)(uVar5 >> 8);
    iVar7 = (int)((ulong)to_x >> 8);
    if (iVar16 != iVar12 || ex != iVar7) {
      if (to_y == uVar4) {
        gray_set_cell(worker,iVar7,iVar12);
        goto LAB_0020f40a;
      }
      lVar11 = to_y - uVar4;
      if (to_x == uVar5) {
        if (lVar11 < 1) {
          do {
            iVar16 = iVar16 + -1;
            pTVar6 = worker->cell;
            pTVar1 = &pTVar6->cover;
            *pTVar1 = *pTVar1 - uVar10;
            pTVar2 = &pTVar6->area;
            *pTVar2 = *pTVar2 + uVar10 * uVar14 * -2;
            gray_set_cell(worker,ex,iVar16);
            uVar10 = 0x100;
          } while (iVar16 != iVar12);
        }
        else {
          iVar7 = 0x100 - uVar10;
          do {
            iVar16 = iVar16 + 1;
            pTVar6 = worker->cell;
            pTVar1 = &pTVar6->cover;
            *pTVar1 = *pTVar1 + iVar7;
            pTVar2 = &pTVar6->area;
            *pTVar2 = *pTVar2 + iVar7 * uVar14 * 2;
            gray_set_cell(worker,ex,iVar16);
            iVar7 = 0x100;
          } while (iVar16 != iVar12);
          uVar10 = 0;
        }
      }
      else {
        lVar13 = to_x - uVar5;
        if (ex == iVar7) {
          local_60 = 0;
        }
        else {
          local_60 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0xffffffff)) / SEXT816(lVar13),0);
        }
        if (iVar16 == iVar12) {
          local_78 = 0;
        }
        else {
          local_78 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / SEXT816(lVar11),0);
        }
        lVar18 = (uVar4 & 0xff) * lVar13 - (uVar5 & 0xff) * lVar11;
        do {
          lVar9 = lVar18 + lVar13 * -0x100;
          if (lVar18 < 1 && (lVar9 != 0 && lVar13 * 0x100 <= lVar18)) {
            pTVar6 = worker->cell;
            uVar8 = (uint)((ulong)(lVar18 * local_60) >> 0x20);
            iVar16 = uVar8 - uVar10;
            pTVar1 = &pTVar6->cover;
            *pTVar1 = *pTVar1 + iVar16;
            pTVar2 = &pTVar6->area;
            *pTVar2 = *pTVar2 + iVar16 * uVar14;
            lVar9 = lVar18 + lVar11 * -0x100;
            uVar15 = (ulong)((int)uVar15 - 1);
            uVar10 = uVar8;
            uVar14 = 0x100;
          }
          else {
            lVar3 = lVar9 + lVar11 * 0x100;
            if ((lVar9 < 1) && (0 < lVar3)) {
              pTVar6 = worker->cell;
              pTVar1 = &pTVar6->cover;
              *pTVar1 = *pTVar1 + (0x100 - uVar10);
              uVar8 = (uint)((ulong)-(local_78 * lVar9) >> 0x20);
              pTVar2 = &pTVar6->area;
              *pTVar2 = *pTVar2 + (uVar14 + uVar8) * (0x100 - uVar10);
              uVar17 = (ulong)((int)uVar17 + 1);
              uVar10 = 0;
              uVar14 = uVar8;
            }
            else {
              lVar9 = lVar18 + lVar11 * 0x100;
              if ((lVar9 < 0) || (0 < lVar3)) {
                pTVar6 = worker->cell;
                pTVar1 = &pTVar6->cover;
                *pTVar1 = *pTVar1 - uVar10;
                uVar8 = (uint)((ulong)-(local_78 * lVar18) >> 0x20);
                pTVar2 = &pTVar6->area;
                *pTVar2 = *pTVar2 - (uVar14 + uVar8) * uVar10;
                lVar9 = lVar18 + lVar13 * 0x100;
                uVar17 = (ulong)((int)uVar17 - 1);
                uVar10 = 0x100;
                uVar14 = uVar8;
              }
              else {
                pTVar6 = worker->cell;
                uVar8 = (uint)((ulong)(lVar9 * local_60) >> 0x20);
                iVar16 = uVar8 - uVar10;
                pTVar1 = &pTVar6->cover;
                *pTVar1 = *pTVar1 + iVar16;
                pTVar2 = &pTVar6->area;
                *pTVar2 = *pTVar2 + (uVar14 + 0x100) * iVar16;
                uVar15 = (ulong)((int)uVar15 + 1);
                uVar10 = uVar8;
                uVar14 = 0;
              }
            }
          }
          gray_set_cell(worker,(TCoord)uVar15,(int)uVar17);
          lVar18 = lVar9;
        } while (((TCoord)uVar15 != iVar7) || ((int)uVar17 != iVar12));
      }
    }
    iVar12 = ((uint)to_y & 0xff) - uVar10;
    pTVar6 = worker->cell;
    pTVar1 = &pTVar6->cover;
    *pTVar1 = *pTVar1 + iVar12;
    pTVar2 = &pTVar6->area;
    *pTVar2 = *pTVar2 + iVar12 * (((uint)to_x & 0xff) + uVar14);
  }
LAB_0020f40a:
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy;
    TCoord  fx1, fy1, fx2, fy2;
    TCoord  ex1, ey1, ex2, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = FRACT( ras.x );
    fy1 = FRACT( ras.y );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      gray_set_cell( RAS_VAR_ ex2, ey2 );
      goto End;
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 * 2 );
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 * 2 );
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      FT_Int64  prod = dx * (FT_Int64)fy1 - dy * (FT_Int64)fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod - dx * ONE_PIXEL                  >  0 &&
                  prod                                   <= 0 ) /* left */
        {
          fx2 = 0;
          fy2 = FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 &&
                  prod - dx * ONE_PIXEL                  <= 0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod                  + dy * ONE_PIXEL >= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = FT_UDIV( prod, dx );
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                                   >  0 &&
                  prod                  + dy * ONE_PIXEL <  0 )    down */
        {
          fx2 = FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );

      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = FRACT( to_x );
    fy2 = FRACT( to_y );

    FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );

  End:
    ras.x = to_x;
    ras.y = to_y;
  }